

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaj3.c
# Opt level: O3

int Maj3_ManExactSynthesis(int nVars,int nNodes,int fVerbose,Vec_Int_t *vLevels)

{
  Vec_Wrd_t *pVVar1;
  word *pwVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  Maj3_Man_t *p;
  long lVar8;
  uint uVar9;
  uint uVar10;
  int level;
  char *__format;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  long lVar15;
  int iMint;
  int pFanins [3];
  timespec ts;
  uint local_d8;
  uint local_d4;
  long local_d0;
  int local_c8;
  int local_c4 [3];
  timespec local_b8;
  long local_a8;
  
  local_c8 = fVerbose;
  iVar5 = clock_gettime(3,&local_b8);
  if (iVar5 < 0) {
    local_d0 = 1;
  }
  else {
    lVar8 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_b8.tv_nsec),8);
    local_d0 = ((lVar8 >> 7) - (lVar8 >> 0x3f)) + local_b8.tv_sec * -1000000;
  }
  local_d8 = 0;
  printf("Running exact synthesis for %d-input majority with %d MAJ3 gates...\n",(ulong)(uint)nVars,
         nNodes);
  p = Maj3_ManAlloc(nVars,nNodes,vLevels);
  if (local_d8 != 0xffffffff) {
    local_d4 = 0;
    uVar9 = 0;
    do {
      iVar5 = clock_gettime(3,&local_b8);
      if (iVar5 < 0) {
        lVar8 = 1;
      }
      else {
        lVar8 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_b8.tv_nsec),8);
        lVar8 = ((lVar8 >> 7) - (lVar8 >> 0x3f)) + local_b8.tv_sec * -1000000;
      }
      iVar5 = Maj3_ManAddCnf(p,local_d8);
      if (iVar5 == 0) {
LAB_005adf75:
        if (local_d8 != 0xffffffff) goto LAB_005ae015;
        break;
      }
      while (iVar5 = bmcg_sat_solver_solve(p->pSat,(int *)0x0,0), iVar5 == 1) {
        iVar5 = Maj3_ManAddConstraintsLazy(p);
        if (iVar5 == 0) {
          iVar5 = 1;
          break;
        }
        if (iVar5 == -1) {
          puts("Became UNSAT after adding lazy constraints.");
          iVar5 = -1;
          break;
        }
        uVar9 = uVar9 + iVar5;
      }
      if (local_c8 != 0) {
        printf("Iter %3d : ",(ulong)local_d4);
        Extra_PrintBinary(_stdout,&local_d8,p->nVars);
        printf("  Var =%5d  ",(ulong)(uint)p->iVar);
        uVar6 = bmcg_sat_solver_clausenum(p->pSat);
        printf("Cla =%6d  ",(ulong)uVar6);
        uVar6 = bmcg_sat_solver_conflictnum(p->pSat);
        printf("Conf =%9d  ",(ulong)uVar6);
        printf("Lazy =%9d  ",(ulong)uVar9);
        level = 3;
        iVar7 = clock_gettime(3,&local_b8);
        if (iVar7 < 0) {
          lVar15 = -1;
        }
        else {
          lVar15 = local_b8.tv_nsec / 1000 + local_b8.tv_sec * 1000000;
        }
        Abc_Print(level,"%s =","Time");
        Abc_Print(level,"%9.2f sec\n",(double)(lVar15 + lVar8) / 1000000.0);
      }
      if (iVar5 == -1) {
        puts("The problem has no solution.");
        goto LAB_005adf75;
      }
      iVar5 = p->nVars;
      iVar7 = p->nObjs;
      if (iVar5 < iVar7) {
        do {
          iVar7 = Maj3_ManFindFanin(p,iVar5,local_c4);
          if (iVar7 != 3) {
            __assert_fail("nFanins == 3",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcMaj3.c"
                          ,0xdf,"int Maj3_ManEval(Maj3_Man_t *)");
          }
          uVar6 = p->nWords;
          pVVar1 = p->vInfo;
          lVar8 = 0;
          do {
            uVar11 = local_c4[lVar8] * uVar6;
            if (((int)uVar11 < 0) || (uVar13 = pVVar1->nSize, (int)uVar13 <= (int)uVar11))
            goto LAB_005ae0bb;
            pwVar2 = pVVar1->pArray;
            (&local_b8.tv_sec)[lVar8] = (__time_t)(pwVar2 + uVar11);
            lVar8 = lVar8 + 1;
          } while (lVar8 != 3);
          if (((int)(uVar6 * iVar5) < 0) || (uVar13 <= uVar6 * iVar5)) goto LAB_005ae0bb;
          if (0 < (int)uVar6) {
            uVar12 = 0;
            do {
              uVar3 = *(ulong *)(local_b8.tv_nsec + uVar12 * 8);
              uVar4 = *(ulong *)(local_a8 + uVar12 * 8);
              pwVar2[uVar6 * iVar5 + uVar12] =
                   uVar4 & uVar3 | (uVar4 | uVar3) & *(ulong *)(local_b8.tv_sec + uVar12 * 8);
              uVar12 = uVar12 + 1;
            } while (uVar6 != uVar12);
          }
          iVar5 = iVar5 + 1;
          iVar7 = p->nObjs;
        } while (iVar5 < iVar7);
        iVar5 = p->nVars;
      }
      uVar11 = 1 << ((byte)iVar5 & 0x1f);
      uVar6 = 0xffffffff;
      if (iVar5 != 0x1f) {
        uVar13 = 1;
        if (1 < (int)uVar11) {
          uVar13 = uVar11;
        }
        uVar12 = 0;
        do {
          if ((iVar5 / 2 <= Abc_TtBitCount8[uVar12 >> 8] + Abc_TtBitCount8[uVar12 & 0xff]) &&
             (Abc_TtBitCount8[uVar12 >> 8] + Abc_TtBitCount8[uVar12 & 0xff] <= iVar5 / 2 + 1)) {
            uVar10 = p->nWords * iVar7;
            if ((int)uVar10 < 0) {
LAB_005ae0bb:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                            ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
            }
            uVar6 = p->vInfo->nSize;
            if ((((int)uVar6 <= (int)uVar10) || (uVar14 = p->nWords * (iVar7 + -1), (int)uVar14 < 0)
                ) || (uVar6 <= uVar14)) goto LAB_005ae0bb;
            pwVar2 = p->vInfo->pArray;
            uVar6 = (uint)uVar12;
            if (((pwVar2[(ulong)uVar14 + (uVar12 >> 6)] ^ pwVar2[(ulong)uVar10 + (uVar12 >> 6)]) >>
                 (uVar12 & 0x3f) & 1) != 0) break;
          }
          uVar10 = (uint)uVar12 + 1;
          uVar12 = (ulong)uVar10;
          uVar6 = 0xffffffff;
        } while (uVar13 != uVar10);
      }
      if ((int)uVar11 <= (int)uVar6) {
        __assert_fail("iMint < (1 << p->nVars)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcMaj3.c"
                      ,0xfa,"int Maj3_ManEval(Maj3_Man_t *)");
      }
      local_d4 = local_d4 + 1;
      local_d8 = uVar6;
    } while (uVar6 != 0xffffffff);
  }
  printf("Realization of %d-input majority using %d MAJ3 gates:\n",(ulong)(uint)p->nVars,
         (ulong)(uint)p->nNodes);
  uVar9 = p->nObjs;
  if (p->nVars < (int)uVar9) {
    do {
      uVar9 = uVar9 - 1;
      printf("%02d = MAJ(",(ulong)uVar9);
      iVar5 = Maj3_ManFindFanin(p,uVar9,(int *)&local_b8);
      if (iVar5 != 3) {
        __assert_fail("nFanins == 3",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcMaj3.c"
                      ,0xcb,"void Maj3_ManPrintSolution(Maj3_Man_t *)");
      }
      lVar8 = 0;
      do {
        uVar6 = *(uint *)((long)&local_b8.tv_sec + lVar8 * 4);
        if (((int)uVar6 < 0) || (p->nVars <= (int)uVar6)) {
          __format = " %02d";
        }
        else {
          uVar6 = uVar6 + 0x61;
          __format = " %c";
        }
        printf(__format,(ulong)uVar6);
        lVar8 = lVar8 + 1;
      } while (lVar8 != 3);
      puts(" )");
    } while (p->nVars < (int)uVar9);
  }
LAB_005ae015:
  Maj3_ManFree(p);
  iVar7 = 3;
  iVar5 = clock_gettime(3,&local_b8);
  if (iVar5 < 0) {
    lVar8 = -1;
  }
  else {
    lVar8 = local_b8.tv_nsec / 1000 + local_b8.tv_sec * 1000000;
  }
  lVar8 = lVar8 + local_d0;
  Abc_Print(iVar7,"%s =","Total runtime");
  Abc_Print(iVar7,"%9.2f sec\n",(double)lVar8 / 1000000.0);
  return (int)(local_d8 == 0xffffffff);
}

Assistant:

int Maj3_ManExactSynthesis( int nVars, int nNodes, int fVerbose, Vec_Int_t * vLevels )
{
    Maj3_Man_t * p;  abctime clkTotal = Abc_Clock();
    int i, status, nLazy, nLazyAll = 0, iMint = 0;
    printf( "Running exact synthesis for %d-input majority with %d MAJ3 gates...\n", nVars, nNodes );
    p = Maj3_ManAlloc( nVars, nNodes, vLevels );
    for ( i = 0; iMint != -1; i++ )
    {
        abctime clk = Abc_Clock();
        if ( !Maj3_ManAddCnf( p, iMint ) )
            break;
        while ( (status = bmcg_sat_solver_solve(p->pSat, NULL, 0)) == GLUCOSE_SAT )
        {
            nLazy = Maj3_ManAddConstraintsLazy( p );
            if ( nLazy == -1 )
            {
                printf( "Became UNSAT after adding lazy constraints.\n" );
                status = GLUCOSE_UNSAT;
                break;
            }
            //printf( "Added %d lazy constraints.\n\n", nLazy );
            if ( nLazy == 0 )
                break;
            nLazyAll += nLazy;
        }
        if ( fVerbose )
        {
            printf( "Iter %3d : ", i );
            Extra_PrintBinary( stdout, (unsigned *)&iMint, p->nVars );
            printf( "  Var =%5d  ", p->iVar );
            printf( "Cla =%6d  ", bmcg_sat_solver_clausenum(p->pSat) );
            printf( "Conf =%9d  ", bmcg_sat_solver_conflictnum(p->pSat) );
            printf( "Lazy =%9d  ", nLazyAll );
            Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
        }
        if ( status == GLUCOSE_UNSAT )
        {
            printf( "The problem has no solution.\n" );
            break;
        }
        iMint = Maj3_ManEval( p );
    }
    if ( iMint == -1 )
        Maj3_ManPrintSolution( p );
    Maj3_ManFree( p );
    Abc_PrintTime( 1, "Total runtime", Abc_Clock() - clkTotal );
    return iMint == -1;
}